

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O0

bool __thiscall cmServer::Serve(cmServer *this,string *errorMessage)

{
  bool bVar1;
  string *errorMessage_local;
  cmServer *this_local;
  
  bVar1 = std::vector<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>::empty
                    (&this->SupportedProtocols);
  if (bVar1) {
    std::__cxx11::string::operator=
              ((string *)errorMessage,"No protocol versions defined. Maybe you need --experimental?"
              );
    this_local._7_1_ = false;
  }
  else {
    if (this->Protocol != (cmServerProtocol *)0x0) {
      __assert_fail("!this->Protocol",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmServer.cxx"
                    ,0xec,"virtual bool cmServer::Serve(std::string *)");
    }
    this_local._7_1_ = cmServerBase::Serve(&this->super_cmServerBase,errorMessage);
  }
  return this_local._7_1_;
}

Assistant:

bool cmServer::Serve(std::string* errorMessage)
{
  if (this->SupportedProtocols.empty()) {
    *errorMessage =
      "No protocol versions defined. Maybe you need --experimental?";
    return false;
  }
  assert(!this->Protocol);

  return cmServerBase::Serve(errorMessage);
}